

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_cv_still_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  _Vector_base<int,_std::allocator<int>_> local_188;
  _InputArray local_170;
  float local_158;
  float local_148;
  Mat image;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  usage();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"-w",(allocator<char> *)&image);
  local_148 = getParamVal(&local_50,argc,argv,2592.0);
  iVar4 = (int)local_148;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"-h",(allocator<char> *)&image);
  local_158 = getParamVal(&local_70,argc,argv,1944.0);
  iVar3 = (int)local_158;
  std::__cxx11::string::~string((string *)&local_70);
  poVar2 = std::operator<<((ostream *)&std::cout,"Initializing ...");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
  poVar2 = std::operator<<(poVar2,"x");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  raspicam::RaspiCam_Still_Cv::set(0x105120,(double)(int)local_148);
  raspicam::RaspiCam_Still_Cv::set(0x105120,(double)(int)local_158);
  raspicam::RaspiCam_Still_Cv::open();
  cv::Mat::Mat(&image);
  poVar2 = std::operator<<((ostream *)&std::cout,"capturing");
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar3 = 0;
  do {
    if (iVar3 == 5) {
      iVar3 = 0;
LAB_00102645:
      cv::Mat::~Mat(&image);
      return iVar3;
    }
    cVar1 = raspicam::RaspiCam_Still_Cv::grab();
    if (cVar1 == '\0') {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Error in grab");
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar3 = -1;
      goto LAB_00102645;
    }
    raspicam::RaspiCam_Still_Cv::retrieve((Mat *)Camera);
    poVar2 = std::operator<<((ostream *)&std::cout,"saving picture");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
    poVar2 = std::operator<<(poVar2,".jpg");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::to_string(&local_d0,iVar3);
    std::operator+(&local_b0,"picture-",&local_d0);
    std::operator+(&local_90,&local_b0,".jpg");
    local_170.sz.width = 0;
    local_170.sz.height = 0;
    local_170.flags = 0x1010000;
    local_170.obj = &image;
    local_188._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cv::imwrite((string *)&local_90,&local_170,(vector *)&local_188);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_188);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int main ( int argc, char *argv[] ) {
    usage();

    int width = getParamVal ( "-w",argc,argv,2592 );//define width
    int height =getParamVal ( "-h",argc,argv,1944 );//define height
    cout << "Initializing ..."<<width<<"x"<<height<<endl;
    Camera.set ( CV_CAP_PROP_FRAME_WIDTH, width );
    Camera.set ( CV_CAP_PROP_FRAME_HEIGHT, height );
    Camera.open();
    cv::Mat image;
    cout<<"capturing"<<endl;
    for(int i=0;i<5;i++){
        if ( !Camera.grab ( ) ) {
            cerr<<"Error in grab"<<endl;
            return -1;
        }
        Camera.retrieve ( image );
        cout<<"saving picture"<<i<<".jpg"<<endl;
        cv::imwrite ( "picture-"+std::to_string(i)+".jpg",image );
    }
    return 0;
}